

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileParser.cpp
# Opt level: O0

void __thiscall Assimp::XFileParser::ReadUntilEndOfLine(XFileParser *this)

{
  XFileParser *this_local;
  
  if ((this->mIsBinaryFormat & 1U) == 0) {
    while (this->mP < this->mEnd) {
      if ((*this->mP == '\n') || (*this->mP == '\r')) {
        this->mP = this->mP + 1;
        this->mLineNumber = this->mLineNumber + 1;
        return;
      }
      this->mP = this->mP + 1;
    }
  }
  return;
}

Assistant:

void XFileParser::ReadUntilEndOfLine()
{
    if( mIsBinaryFormat)
        return;

    while( mP < mEnd)
    {
        if( *mP == '\n' || *mP == '\r')
        {
            ++mP; mLineNumber++;
            return;
        }

        ++mP;
    }
}